

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_free(nk_context *ctx)

{
  void *pvVar1;
  nk_plugin_free p_Var2;
  nk_page *pnVar3;
  nk_page *pnVar4;
  ulong uVar5;
  ulong uVar6;
  nk_buffer *__s;
  nk_context *__s_00;
  nk_style *__s_01;
  
  if (ctx != (nk_context *)0x0) {
    pvVar1 = (ctx->memory).memory.ptr;
    if (((pvVar1 != (void *)0x0) && ((ctx->memory).type != NK_BUFFER_FIXED)) &&
       (p_Var2 = (ctx->memory).pool.free, p_Var2 != (nk_plugin_free)0x0)) {
      (*p_Var2)((ctx->memory).pool.userdata,pvVar1);
    }
    if ((ctx->use_pool != 0) &&
       (pnVar4 = (ctx->pool).pages, pnVar4 != (nk_page *)0x0 && (ctx->pool).type != NK_BUFFER_FIXED)
       ) {
      do {
        pnVar3 = pnVar4->next;
        (*(ctx->pool).alloc.free)((ctx->pool).alloc.userdata,pnVar4);
        pnVar4 = pnVar3;
      } while (pnVar3 != (nk_page *)0x0);
    }
    uVar5 = (ulong)ctx & 3;
    if (uVar5 == 0) {
      uVar6 = 0x168;
      __s_00 = ctx;
    }
    else {
      memset(ctx,0,4 - uVar5);
      uVar6 = uVar5 | 0x164;
      __s_00 = (nk_context *)((4 - uVar5) + (long)ctx);
    }
    uVar5 = (ulong)((uint)uVar6 & 0xfffffffc);
    memset(__s_00,0,uVar5);
    if ((uVar6 & 3) != 0) {
      memset((void *)((long)&(__s_00->input).keyboard.keys[0].down + uVar5),0,uVar6 & 3);
    }
    __s_01 = &ctx->style;
    uVar5 = (ulong)__s_01 & 3;
    if (uVar5 == 0) {
      uVar6 = 0x1d78;
    }
    else {
      memset(__s_01,0,4 - uVar5);
      uVar6 = uVar5 | 0x1d74;
      __s_01 = (nk_style *)((long)__s_01 + (4 - uVar5));
    }
    __s = &ctx->memory;
    uVar5 = (ulong)((uint)uVar6 & 0xfffffffc);
    memset(__s_01,0,uVar5);
    if ((uVar6 & 3) != 0) {
      memset((void *)((long)__s_01->cursors + (uVar5 - 8)),0,uVar6 & 3);
    }
    uVar5 = (ulong)__s & 3;
    if (uVar5 == 0) {
      uVar6 = 0x78;
    }
    else {
      memset(__s,0,4 - uVar5);
      uVar6 = uVar5 | 0x74;
      __s = (nk_buffer *)((long)__s + (4 - uVar5));
    }
    uVar5 = (ulong)((uint)uVar6 & 0xfffffffc);
    memset(__s,0,uVar5);
    if ((uVar6 & 3) != 0) {
      memset((void *)((long)&__s->marker[0].active + uVar5),0,uVar6 & 3);
    }
    ctx->build = 0;
    ctx->begin = (nk_window *)0x0;
    ctx->end = (nk_window *)0x0;
    ctx->active = (nk_window *)0x0;
    ctx->current = (nk_window *)0x0;
    ctx->freelist = (nk_page_element *)0x0;
    ctx->count = 0;
    ctx->seq = 0;
    return;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x3a69,"void nk_free(struct nk_context *)");
}

Assistant:

NK_API void
nk_free(struct nk_context *ctx)
{
    NK_ASSERT(ctx);
    if (!ctx) return;
    nk_buffer_free(&ctx->memory);
    if (ctx->use_pool)
        nk_pool_free(&ctx->pool);

    nk_zero(&ctx->input, sizeof(ctx->input));
    nk_zero(&ctx->style, sizeof(ctx->style));
    nk_zero(&ctx->memory, sizeof(ctx->memory));

    ctx->seq = 0;
    ctx->build = 0;
    ctx->begin = 0;
    ctx->end = 0;
    ctx->active = 0;
    ctx->current = 0;
    ctx->freelist = 0;
    ctx->count = 0;
}